

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPDeclIdx cp_add(CPDecl *decl,CTInfo info,CTSize size)

{
  ErrMsg em;
  ErrMsg in_EDX;
  ErrMsg in_ESI;
  ErrMsg *in_RDI;
  CPDeclIdx top;
  
  em = *in_RDI;
  if (99 < em) {
    cp_err((CPState *)CONCAT44(in_ESI,in_EDX),em);
  }
  in_RDI[(ulong)em * 4 + 0x10] = in_ESI;
  in_RDI[(ulong)em * 4 + 0x11] = in_EDX;
  *(undefined2 *)(in_RDI + (ulong)em * 4 + 0x12) = LJ_ERR_ERRMEM;
  in_RDI[(ulong)em * 4 + 0x13] = LJ_ERR_ERRMEM;
  *(undefined2 *)((long)in_RDI + (ulong)em * 0x10 + 0x4a) =
       *(undefined2 *)((long)in_RDI + (ulong)in_RDI[1] * 0x10 + 0x4a);
  *(short *)((long)in_RDI + (ulong)in_RDI[1] * 0x10 + 0x4a) = (short)em;
  *in_RDI = em + 1;
  return em;
}

Assistant:

static CPDeclIdx cp_add(CPDecl *decl, CTInfo info, CTSize size)
{
  CPDeclIdx top = decl->top;
  if (top >= CPARSE_MAX_DECLSTACK) cp_err(decl->cp, LJ_ERR_XLEVELS);
  decl->stack[top].info = info;
  decl->stack[top].size = size;
  decl->stack[top].sib = 0;
  setgcrefnull(decl->stack[top].name);
  decl->stack[top].next = decl->stack[decl->pos].next;
  decl->stack[decl->pos].next = (CTypeID1)top;
  decl->top = top+1;
  return top;
}